

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

char * alloc_string_sized(char *in,size_t insize)

{
  char *dst;
  char *out;
  size_t insize_local;
  char *in_local;
  
  dst = (char *)lodepng_malloc(insize + 1);
  if (dst != (char *)0x0) {
    lodepng_memcpy(dst,in,insize);
    dst[insize] = '\0';
  }
  return dst;
}

Assistant:

static char* alloc_string_sized(const char* in, size_t insize) {
  char* out = (char*)lodepng_malloc(insize + 1);
  if(out) {
    lodepng_memcpy(out, in, insize);
    out[insize] = 0;
  }
  return out;
}